

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O2

void auxsort(lua_State *L,int l,int u)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int n;
  
LAB_00152864:
  if (l < u) {
    lua_rawgeti(L,1,l);
    lua_rawgeti(L,1,u);
    iVar1 = sort_comp(L,-1,-2);
    if (iVar1 == 0) {
      lua_settop(L,-3);
    }
    else {
      set2(L,l,u);
    }
    if (u - l != 1) {
      iVar2 = (u + l) / 2;
      lua_rawgeti(L,1,iVar2);
      lua_rawgeti(L,1,l);
      iVar3 = sort_comp(L,-2,-1);
      iVar1 = l;
      if (iVar3 == 0) {
        lua_settop(L,-2);
        lua_rawgeti(L,1,u);
        iVar3 = sort_comp(L,-1,-2);
        iVar1 = u;
        if (iVar3 != 0) goto LAB_00152954;
        lua_settop(L,-3);
      }
      else {
LAB_00152954:
        set2(L,iVar2,iVar1);
      }
      if (u - l != 2) {
        lua_rawgeti(L,1,iVar2);
        lua_pushvalue(L,-1);
        iVar3 = u + -1;
        lua_rawgeti(L,1,iVar3);
        set2(L,iVar2,iVar3);
        iVar1 = iVar3;
        iVar2 = l;
        do {
          while( true ) {
            n = iVar2 + 1;
            lua_rawgeti(L,1,n);
            iVar4 = sort_comp(L,-1,-2);
            if (iVar4 == 0) break;
            if (u <= n) {
LAB_00152aec:
              lj_err_caller(L,LJ_ERR_TABSORT);
            }
            lua_settop(L,-2);
            iVar2 = n;
          }
          while( true ) {
            iVar4 = iVar1 + -1;
            lua_rawgeti(L,1,iVar4);
            iVar5 = sort_comp(L,-3,-1);
            if (iVar5 == 0) break;
            if (iVar4 <= l) goto LAB_00152aec;
            lua_settop(L,-2);
            iVar1 = iVar4;
          }
          if (iVar1 <= n) goto LAB_00152a4c;
          iVar1 = iVar1 + -1;
          set2(L,n,iVar1);
          iVar2 = n;
        } while( true );
      }
    }
  }
  return;
LAB_00152a4c:
  lua_settop(L,-4);
  lua_rawgeti(L,1,iVar3);
  lua_rawgeti(L,1,n);
  set2(L,iVar3,n);
  iVar3 = l;
  iVar1 = iVar2;
  iVar4 = iVar2 + 2;
  if (u - n <= n - l) {
    iVar3 = iVar2 + 2;
    iVar1 = u;
    iVar4 = l;
    u = iVar2;
  }
  l = iVar4;
  auxsort(L,iVar3,iVar1);
  goto LAB_00152864;
}

Assistant:

static void auxsort(lua_State *L, int l, int u)
{
  while (l < u) {  /* for tail recursion */
    int i, j;
    /* sort elements a[l], a[(l+u)/2] and a[u] */
    lua_rawgeti(L, 1, l);
    lua_rawgeti(L, 1, u);
    if (sort_comp(L, -1, -2))  /* a[u] < a[l]? */
      set2(L, l, u);  /* swap a[l] - a[u] */
    else
      lua_pop(L, 2);
    if (u-l == 1) break;  /* only 2 elements */
    i = (l+u)/2;
    lua_rawgeti(L, 1, i);
    lua_rawgeti(L, 1, l);
    if (sort_comp(L, -2, -1)) {  /* a[i]<a[l]? */
      set2(L, i, l);
    } else {
      lua_pop(L, 1);  /* remove a[l] */
      lua_rawgeti(L, 1, u);
      if (sort_comp(L, -1, -2))  /* a[u]<a[i]? */
	set2(L, i, u);
      else
	lua_pop(L, 2);
    }
    if (u-l == 2) break;  /* only 3 elements */
    lua_rawgeti(L, 1, i);  /* Pivot */
    lua_pushvalue(L, -1);
    lua_rawgeti(L, 1, u-1);
    set2(L, i, u-1);
    /* a[l] <= P == a[u-1] <= a[u], only need to sort from l+1 to u-2 */
    i = l; j = u-1;
    for (;;) {  /* invariant: a[l..i] <= P <= a[j..u] */
      /* repeat ++i until a[i] >= P */
      while (lua_rawgeti(L, 1, ++i), sort_comp(L, -1, -2)) {
	if (i>=u) lj_err_caller(L, LJ_ERR_TABSORT);
	lua_pop(L, 1);  /* remove a[i] */
      }
      /* repeat --j until a[j] <= P */
      while (lua_rawgeti(L, 1, --j), sort_comp(L, -3, -1)) {
	if (j<=l) lj_err_caller(L, LJ_ERR_TABSORT);
	lua_pop(L, 1);  /* remove a[j] */
      }
      if (j<i) {
	lua_pop(L, 3);  /* pop pivot, a[i], a[j] */
	break;
      }
      set2(L, i, j);
    }
    lua_rawgeti(L, 1, u-1);
    lua_rawgeti(L, 1, i);
    set2(L, u-1, i);  /* swap pivot (a[u-1]) with a[i] */
    /* a[l..i-1] <= a[i] == P <= a[i+1..u] */
    /* adjust so that smaller half is in [j..i] and larger one in [l..u] */
    if (i-l < u-i) {
      j=l; i=i-1; l=i+2;
    } else {
      j=i+1; i=u; u=j-2;
    }
    auxsort(L, j, i);  /* call recursively the smaller one */
  }  /* repeat the routine for the larger one */
}